

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O0

int __thiscall userinfo_t::SkinChanged(userinfo_t *this,char *skinname,int playerclass)

{
  int intval;
  FBaseCVar **ppFVar1;
  FName local_24;
  int local_20;
  int local_1c;
  int skinnum;
  int playerclass_local;
  char *skinname_local;
  userinfo_t *this_local;
  
  local_1c = playerclass;
  _skinnum = skinname;
  skinname_local = (char *)this;
  intval = R_FindSkin(skinname,playerclass);
  local_20 = intval;
  FName::FName(&local_24,NAME_Skin);
  ppFVar1 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::operator[]
                      (&this->
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       ,&local_24);
  FIntCVar::operator=((FIntCVar *)*ppFVar1,intval);
  return local_20;
}

Assistant:

int userinfo_t::SkinChanged(const char *skinname, int playerclass)
{
	int skinnum = R_FindSkin(skinname, playerclass);
	*static_cast<FIntCVar *>((*this)[NAME_Skin]) = skinnum;
	return skinnum;
}